

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP3Deserializer::ParseMetadata
          (BP3Deserializer *this,BufferSTL *bufferSTL,Engine *engine)

{
  char *pcVar1;
  bool bVar2;
  string local_48;
  
  ParseMinifooter(this,bufferSTL);
  bVar2 = engine->m_IO->m_ArrayOrder != RowMajor;
  pcVar1 = "Fortran";
  if (!bVar2) {
    pcVar1 = "C++";
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,pcVar1,pcVar1 + (ulong)bVar2 * 4 + 3);
  ParsePGIndex(this,bufferSTL,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  ParseVariablesIndex(this,bufferSTL,engine);
  ParseAttributesIndex(this,bufferSTL,engine);
  return;
}

Assistant:

void BP3Deserializer::ParseMetadata(const BufferSTL &bufferSTL, core::Engine &engine)

{
    ParseMinifooter(bufferSTL);
    ParsePGIndex(bufferSTL,
                 (engine.m_IO.m_ArrayOrder == ArrayOrdering::RowMajor) ? "C++" : "Fortran");
    ParseVariablesIndex(bufferSTL, engine);
    ParseAttributesIndex(bufferSTL, engine);
}